

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

void __thiscall
pbrt::CameraSceneEntity::CameraSceneEntity
          (CameraSceneEntity *this,string *name,ParameterDictionary *parameters,FileLoc loc,
          CameraTransform *cameraTransform,string *medium)

{
  FileLoc loc_00;
  void *in_RCX;
  ParameterDictionary *in_RDX;
  string *in_RSI;
  ParameterDictionary *in_RDI;
  ParsedParameter *in_R8;
  char *in_stack_00000008;
  undefined4 uStack0000000000000010;
  undefined4 uStack0000000000000014;
  ParameterDictionary *in_stack_ffffffffffffff18;
  SceneEntity *this_00;
  size_t in_stack_ffffffffffffff50;
  undefined8 local_28;
  void *local_20;
  
  this_00 = (SceneEntity *)&stack0xffffffffffffff70;
  local_28 = in_R8;
  local_20 = in_RCX;
  ParameterDictionary::ParameterDictionary(in_RDX,in_stack_ffffffffffffff18);
  loc_00.filename._M_str = in_stack_00000008;
  loc_00.filename._M_len = in_stack_ffffffffffffff50;
  loc_00.line = uStack0000000000000010;
  loc_00.column = uStack0000000000000014;
  SceneEntity::SceneEntity(this_00,in_RSI,in_RDI,loc_00);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x690330);
  memcpy((void *)((long)&in_RDI[1].params.field_2 + 0x28),local_20,0x338);
  std::__cxx11::string::string
            ((string *)((long)&in_RDI[9].params.field_2 + 0x20),(string *)local_28);
  return;
}

Assistant:

CameraSceneEntity(const std::string &name, ParameterDictionary parameters,
                      FileLoc loc, const CameraTransform &cameraTransform,
                      const std::string &medium)
        : SceneEntity(name, parameters, loc),
          cameraTransform(cameraTransform),
          medium(medium) {}